

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O0

void recall_tree_ns::save_load_tree(recall_tree *b,io_buf *model_file,bool read,bool text)

{
  size_t sVar1;
  ostream *poVar2;
  io_buf *piVar3;
  byte in_CL;
  uint uVar4;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  node_pred *pred;
  uint32_t k_1;
  uint32_t k;
  size_t n_preds;
  node *cn;
  uint32_t j_1;
  uint32_t j;
  size_t n_nodes;
  stringstream msg;
  undefined4 in_stack_fffffffffffffbbc;
  v_array<recall_tree_ns::node> *in_stack_fffffffffffffbc0;
  ostream *in_stack_fffffffffffffbc8;
  undefined1 text_00;
  stringstream *in_stack_fffffffffffffbd0;
  ostream *in_stack_fffffffffffffbd8;
  undefined1 read_00;
  ostream *in_stack_fffffffffffffbe0;
  ostream *in_stack_fffffffffffffbe8;
  ostream *in_stack_fffffffffffffbf0;
  io_buf *in_stack_fffffffffffffbf8;
  recall_tree *in_stack_fffffffffffffc00;
  uint local_24c;
  node_pred local_248;
  uint local_234;
  size_t local_230;
  node *local_228;
  uint local_21c;
  uint local_1bc;
  size_t local_1b8;
  stringstream local_1a0 [16];
  ostream local_190;
  byte local_12;
  byte local_11;
  long local_8;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  local_8 = in_RDI;
  sVar1 = v_array<int>::size((v_array<int> *)(in_RSI + 0x30));
  if (sVar1 != 0) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar2 = std::operator<<(&local_190,"k");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(uint *)(local_8 + 8));
    std::operator<<(poVar2," ");
    bin_text_read_write_fixed
              (in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0,
               (size_t)in_stack_fffffffffffffbe8,(char *)in_stack_fffffffffffffbe0,
               SUB81((ulong)in_stack_fffffffffffffbd8 >> 0x38,0),in_stack_fffffffffffffbd0,
               SUB81((ulong)in_stack_fffffffffffffbc8 >> 0x38,0));
    poVar2 = std::operator<<(&local_190,"node_only");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(*(byte *)(local_8 + 0xc) & 1));
    std::operator<<(poVar2," ");
    bin_text_read_write_fixed
              (in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0,
               (size_t)in_stack_fffffffffffffbe8,(char *)in_stack_fffffffffffffbe0,
               SUB81((ulong)in_stack_fffffffffffffbd8 >> 0x38,0),in_stack_fffffffffffffbd0,
               SUB81((ulong)in_stack_fffffffffffffbc8 >> 0x38,0));
    local_1b8 = v_array<recall_tree_ns::node>::size
                          ((v_array<recall_tree_ns::node> *)(local_8 + 0x10));
    poVar2 = std::operator<<(&local_190,"nodes");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1b8);
    std::operator<<(poVar2," ");
    uVar4 = local_12 & 1;
    bin_text_read_write_fixed
              (in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0,
               (size_t)in_stack_fffffffffffffbe8,(char *)in_stack_fffffffffffffbe0,
               SUB81((ulong)in_stack_fffffffffffffbd8 >> 0x38,0),in_stack_fffffffffffffbd0,
               SUB81((ulong)in_stack_fffffffffffffbc8 >> 0x38,0));
    if ((local_11 & 1) != 0) {
      v_array<recall_tree_ns::node>::clear(in_stack_fffffffffffffbc0);
      for (local_1bc = 0; local_1bc < local_1b8; local_1bc = local_1bc + 1) {
        node::node((node *)0x2a7a2a);
        v_array<recall_tree_ns::node>::push_back
                  (in_stack_fffffffffffffbc0,(node *)CONCAT44(in_stack_fffffffffffffbbc,uVar4));
      }
    }
    poVar2 = std::operator<<(&local_190,"max_candidates");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(ulong *)(local_8 + 0x30));
    std::operator<<(poVar2," ");
    bin_text_read_write_fixed
              (in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0,
               (size_t)in_stack_fffffffffffffbe8,(char *)in_stack_fffffffffffffbe0,
               SUB81((ulong)in_stack_fffffffffffffbd8 >> 0x38,0),in_stack_fffffffffffffbd0,
               SUB81((ulong)in_stack_fffffffffffffbc8 >> 0x38,0));
    poVar2 = std::operator<<(&local_190,"max_depth");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(ulong *)(local_8 + 0x40));
    std::operator<<(poVar2," ");
    bin_text_read_write_fixed
              (in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0,
               (size_t)in_stack_fffffffffffffbe8,(char *)in_stack_fffffffffffffbe0,
               SUB81((ulong)in_stack_fffffffffffffbd8 >> 0x38,0),in_stack_fffffffffffffbd0,
               SUB81((ulong)in_stack_fffffffffffffbc8 >> 0x38,0));
    for (local_21c = 0; local_21c < local_1b8; local_21c = local_21c + 1) {
      local_228 = v_array<recall_tree_ns::node>::operator[]
                            ((v_array<recall_tree_ns::node> *)(local_8 + 0x10),(ulong)local_21c);
      poVar2 = std::operator<<(&local_190,"parent");
      poVar2 = std::operator<<(poVar2," = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_228->parent);
      std::operator<<(poVar2," ");
      bin_text_read_write_fixed
                (in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0,
                 (size_t)in_stack_fffffffffffffbe8,(char *)in_stack_fffffffffffffbe0,
                 SUB81((ulong)in_stack_fffffffffffffbd8 >> 0x38,0),in_stack_fffffffffffffbd0,
                 SUB81((ulong)in_stack_fffffffffffffbc8 >> 0x38,0));
      poVar2 = std::operator<<(&local_190,"recall_lbest");
      poVar2 = std::operator<<(poVar2," = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_228->recall_lbest);
      std::operator<<(poVar2," ");
      bin_text_read_write_fixed
                (in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0,
                 (size_t)in_stack_fffffffffffffbe8,(char *)in_stack_fffffffffffffbe0,
                 SUB81((ulong)in_stack_fffffffffffffbd8 >> 0x38,0),in_stack_fffffffffffffbd0,
                 SUB81((ulong)in_stack_fffffffffffffbc8 >> 0x38,0));
      poVar2 = std::operator<<(&local_190,"internal");
      poVar2 = std::operator<<(poVar2," = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(local_228->internal & 1));
      std::operator<<(poVar2," ");
      bin_text_read_write_fixed
                (in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0,
                 (size_t)in_stack_fffffffffffffbe8,(char *)in_stack_fffffffffffffbe0,
                 SUB81((ulong)in_stack_fffffffffffffbd8 >> 0x38,0),in_stack_fffffffffffffbd0,
                 SUB81((ulong)in_stack_fffffffffffffbc8 >> 0x38,0));
      poVar2 = std::operator<<(&local_190,"depth");
      poVar2 = std::operator<<(poVar2," = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_228->depth);
      std::operator<<(poVar2," ");
      bin_text_read_write_fixed
                (in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0,
                 (size_t)in_stack_fffffffffffffbe8,(char *)in_stack_fffffffffffffbe0,
                 SUB81((ulong)in_stack_fffffffffffffbd8 >> 0x38,0),in_stack_fffffffffffffbd0,
                 SUB81((ulong)in_stack_fffffffffffffbc8 >> 0x38,0));
      poVar2 = std::operator<<(&local_190,"base_router");
      poVar2 = std::operator<<(poVar2," = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_228->base_router);
      std::operator<<(poVar2," ");
      bin_text_read_write_fixed
                (in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0,
                 (size_t)in_stack_fffffffffffffbe8,(char *)in_stack_fffffffffffffbe0,
                 SUB81((ulong)in_stack_fffffffffffffbd8 >> 0x38,0),in_stack_fffffffffffffbd0,
                 SUB81((ulong)in_stack_fffffffffffffbc8 >> 0x38,0));
      poVar2 = std::operator<<(&local_190,"left");
      poVar2 = std::operator<<(poVar2," = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_228->left);
      std::operator<<(poVar2," ");
      bin_text_read_write_fixed
                (in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0,
                 (size_t)in_stack_fffffffffffffbe8,(char *)in_stack_fffffffffffffbe0,
                 SUB81((ulong)in_stack_fffffffffffffbd8 >> 0x38,0),in_stack_fffffffffffffbd0,
                 SUB81((ulong)in_stack_fffffffffffffbc8 >> 0x38,0));
      poVar2 = std::operator<<(&local_190,"right");
      poVar2 = std::operator<<(poVar2," = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_228->right);
      std::operator<<(poVar2," ");
      bin_text_read_write_fixed
                (in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0,
                 (size_t)in_stack_fffffffffffffbe8,(char *)in_stack_fffffffffffffbe0,
                 SUB81((ulong)in_stack_fffffffffffffbd8 >> 0x38,0),in_stack_fffffffffffffbd0,
                 SUB81((ulong)in_stack_fffffffffffffbc8 >> 0x38,0));
      poVar2 = std::operator<<(&local_190,"n");
      poVar2 = std::operator<<(poVar2," = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_228->n);
      std::operator<<(poVar2," ");
      bin_text_read_write_fixed
                (in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0,
                 (size_t)in_stack_fffffffffffffbe8,(char *)in_stack_fffffffffffffbe0,
                 SUB81((ulong)in_stack_fffffffffffffbd8 >> 0x38,0),in_stack_fffffffffffffbd0,
                 SUB81((ulong)in_stack_fffffffffffffbc8 >> 0x38,0));
      poVar2 = std::operator<<(&local_190,"entropy");
      poVar2 = std::operator<<(poVar2," = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_228->entropy);
      std::operator<<(poVar2," ");
      bin_text_read_write_fixed
                (in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0,
                 (size_t)in_stack_fffffffffffffbe8,(char *)in_stack_fffffffffffffbe0,
                 SUB81((ulong)in_stack_fffffffffffffbd8 >> 0x38,0),in_stack_fffffffffffffbd0,
                 SUB81((ulong)in_stack_fffffffffffffbc8 >> 0x38,0));
      poVar2 = std::operator<<(&local_190,"passes");
      poVar2 = std::operator<<(poVar2," = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_228->passes);
      std::operator<<(poVar2," ");
      bin_text_read_write_fixed
                (in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0,
                 (size_t)in_stack_fffffffffffffbe8,(char *)in_stack_fffffffffffffbe0,
                 SUB81((ulong)in_stack_fffffffffffffbd8 >> 0x38,0),in_stack_fffffffffffffbd0,
                 SUB81((ulong)in_stack_fffffffffffffbc8 >> 0x38,0));
      local_230 = v_array<recall_tree_ns::node_pred>::size(&local_228->preds);
      poVar2 = std::operator<<(&local_190,"n_preds");
      poVar2 = std::operator<<(poVar2," = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_230);
      std::operator<<(poVar2," ");
      uVar4 = local_12 & 1;
      bin_text_read_write_fixed
                (in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0,
                 (size_t)in_stack_fffffffffffffbe8,(char *)in_stack_fffffffffffffbe0,
                 SUB81((ulong)in_stack_fffffffffffffbd8 >> 0x38,0),in_stack_fffffffffffffbd0,
                 SUB81((ulong)in_stack_fffffffffffffbc8 >> 0x38,0));
      if ((local_11 & 1) != 0) {
        v_array<recall_tree_ns::node_pred>::clear
                  ((v_array<recall_tree_ns::node_pred> *)in_stack_fffffffffffffbc0);
        for (local_234 = 0; local_234 < local_230; local_234 = local_234 + 1) {
          in_stack_fffffffffffffc00 = (recall_tree *)&local_228->preds;
          node_pred::node_pred(&local_248,0);
          v_array<recall_tree_ns::node_pred>::push_back
                    ((v_array<recall_tree_ns::node_pred> *)in_stack_fffffffffffffbc0,
                     (node_pred *)CONCAT44(in_stack_fffffffffffffbbc,uVar4));
        }
      }
      local_24c = 0;
      while( true ) {
        read_00 = (undefined1)((ulong)in_stack_fffffffffffffbd8 >> 0x38);
        text_00 = (undefined1)((ulong)in_stack_fffffffffffffbc8 >> 0x38);
        if (local_230 <= local_24c) break;
        piVar3 = (io_buf *)
                 v_array<recall_tree_ns::node_pred>::operator[](&local_228->preds,(ulong)local_24c);
        in_stack_fffffffffffffbf8 = piVar3;
        in_stack_fffffffffffffbf0 = std::operator<<(&local_190,"label");
        in_stack_fffffffffffffbe8 = std::operator<<(in_stack_fffffffffffffbf0," = ");
        in_stack_fffffffffffffbe0 =
             (ostream *)
             std::ostream::operator<<(in_stack_fffffffffffffbe8,*(uint *)&piVar3->_vptr_io_buf);
        std::operator<<(in_stack_fffffffffffffbe0," ");
        bin_text_read_write_fixed
                  (in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0,
                   (size_t)in_stack_fffffffffffffbe8,(char *)in_stack_fffffffffffffbe0,(bool)read_00
                   ,in_stack_fffffffffffffbd0,(bool)text_00);
        in_stack_fffffffffffffbd8 = std::operator<<(&local_190,"label_count");
        in_stack_fffffffffffffbd0 = (stringstream *)std::operator<<(in_stack_fffffffffffffbd8," = ")
        ;
        in_stack_fffffffffffffbc8 =
             (ostream *)
             std::ostream::operator<<(in_stack_fffffffffffffbd0,*(double *)&piVar3->_verify_hash);
        std::operator<<(in_stack_fffffffffffffbc8," ");
        bin_text_read_write_fixed
                  (in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0,
                   (size_t)in_stack_fffffffffffffbe8,(char *)in_stack_fffffffffffffbe0,
                   SUB81((ulong)in_stack_fffffffffffffbd8 >> 0x38,0),in_stack_fffffffffffffbd0,
                   SUB81((ulong)in_stack_fffffffffffffbc8 >> 0x38,0));
        local_24c = local_24c + 1;
      }
      if ((local_11 & 1) != 0) {
        compute_recall_lbest(in_stack_fffffffffffffc00,(node *)in_stack_fffffffffffffbf8);
      }
    }
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  return;
}

Assistant:

void save_load_tree(recall_tree& b, io_buf& model_file, bool read, bool text)
{
  if (model_file.files.size() > 0)
  {
    stringstream msg;

    writeit(b.k, "k");
    writeit(b.node_only, "node_only");
    writeitvar(b.nodes.size(), "nodes", n_nodes);

    if (read)
    {
      b.nodes.clear();
      for (uint32_t j = 0; j < n_nodes; ++j)
      {
        b.nodes.push_back(node());
      }
    }

    writeit(b.max_candidates, "max_candidates");
    writeit(b.max_depth, "max_depth");

    for (uint32_t j = 0; j < n_nodes; ++j)
    {
      node* cn = &b.nodes[j];

      writeit(cn->parent, "parent");
      writeit(cn->recall_lbest, "recall_lbest");
      writeit(cn->internal, "internal");
      writeit(cn->depth, "depth");
      writeit(cn->base_router, "base_router");
      writeit(cn->left, "left");
      writeit(cn->right, "right");
      writeit(cn->n, "n");
      writeit(cn->entropy, "entropy");
      writeit(cn->passes, "passes");

      writeitvar(cn->preds.size(), "n_preds", n_preds);

      if (read)
      {
        cn->preds.clear();

        for (uint32_t k = 0; k < n_preds; ++k)
        {
          cn->preds.push_back(node_pred(0));
        }
      }

      for (uint32_t k = 0; k < n_preds; ++k)
      {
        node_pred* pred = &cn->preds[k];

        writeit(pred->label, "label");
        writeit(pred->label_count, "label_count");
      }

      if (read)
      {
        compute_recall_lbest(b, cn);
      }
    }
  }
}